

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O0

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerOrArrayType
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  allocator<char> local_79;
  string local_78;
  SyntaxToken local_58;
  SyntaxToken *local_18;
  SyntaxToken *tk_local;
  DiagnosticsReporter *this_local;
  
  local_58.field_10 = tk->field_10;
  local_58.tree_ = tk->tree_;
  local_58.syntaxK_ = tk->syntaxK_;
  local_58.byteSize_ = tk->byteSize_;
  local_58.charSize_ = tk->charSize_;
  local_58._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_58.byteOffset_ = tk->byteOffset_;
  local_58.charOffset_ = tk->charOffset_;
  local_58.matchingBracket_ = tk->matchingBracket_;
  local_58.field_7 = tk->field_7;
  local_58._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_58.lineno_ = tk->lineno_;
  local_58.column_ = tk->column_;
  local_58._44_4_ = *(undefined4 *)&tk->field_0x2c;
  local_18 = tk;
  tk_local = (SyntaxToken *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"pointer or array",&local_79);
  ExpectedExpressionOfType_CORE
            (this,&local_58,&ID_of_ExpectedExpressionOfPointerOrArrayType_abi_cxx11_,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  SyntaxToken::~SyntaxToken(&local_58);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerOrArrayType(SyntaxToken tk)
{
    ExpectedExpressionOfType_CORE(
                tk,
                ID_of_ExpectedExpressionOfPointerOrArrayType,
                "pointer or array");
}